

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

complex dja::normalize(complex *z)

{
  vec2 local_28;
  vec2 local_20;
  complex *local_18;
  complex *z_local;
  
  local_18 = z;
  vec2::vec2(&local_28,z);
  local_20 = normalize(&local_28);
  complex::complex((complex *)&z_local,&local_20);
  return (complex)z_local;
}

Assistant:

Z normalize(const Z& z) {return Z(normalize(V2(z)));}